

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O0

void __thiscall PatchNewGame::inject_code(PatchNewGame *this,ROM *rom,World *world)

{
  World *pWVar1;
  uint8_t uVar2;
  uint16_t word;
  Code *pCVar3;
  Code local_a8;
  uint32_t local_28;
  uint8_t local_21;
  uint32_t func_init_game;
  uint8_t starting_life;
  World *world_local;
  ROM *rom_local;
  PatchNewGame *this_local;
  
  _func_init_game = world;
  world_local = (World *)rom;
  rom_local = (ROM *)this;
  word = World::spawn_map_id(world);
  md::ROM::set_word(rom,0x27f4,word);
  pWVar1 = world_local;
  uVar2 = World::spawn_position_x(_func_init_game);
  md::ROM::set_byte((ROM *)pWVar1,0x27fd,uVar2);
  pWVar1 = world_local;
  uVar2 = World::spawn_position_y(_func_init_game);
  md::ROM::set_byte((ROM *)pWVar1,0x2805,uVar2);
  local_21 = World::starting_life(_func_init_game);
  md::ROM::set_byte((ROM *)world_local,0x27b4,local_21 + 0xff);
  md::ROM::set_byte((ROM *)world_local,0x27bc,local_21 + 0xff);
  local_28 = inject_func_init_game(this,(ROM *)world_local,_func_init_game);
  pWVar1 = world_local;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl._0_8_ = 0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_a8);
  pCVar3 = md::Code::jsr(&local_a8,local_28);
  pCVar3 = md::Code::nop(pCVar3,1);
  md::ROM::set_code((ROM *)pWVar1,0x2700,pCVar3);
  md::Code::~Code(&local_a8);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        // Edit spawn map and position
        rom.set_word(0x0027F4, world.spawn_map_id());
        rom.set_byte(0x0027FD, world.spawn_position_x());
        rom.set_byte(0x002805, world.spawn_position_y());

        // Edit starting life
        uint8_t starting_life = world.starting_life();
        rom.set_byte(0x0027B4, starting_life-1);
        rom.set_byte(0x0027BC, starting_life-1);

        // Inject a function initializing everyhting properly on new game (flags...)
        uint32_t func_init_game = inject_func_init_game(rom, world);
        rom.set_code(0x002700, md::Code().jsr(func_init_game).nop());
        // Replace the bitset of the "no music flag" by a jump to 'func_init_game'
        // 0x002700:
        // Before: 	[08F9] bset 3 -> $FF1027
        // After:	[4EB9] jsr func_init_game ; [4E71] nop
    }